

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

int uECC_sign_with_k(uint8_t *private_key,uint8_t *message_hash,uint hash_size,uECC_word_t *k,
                    uint8_t *signature,uECC_Curve curve)

{
  uECC_word_t *left;
  char cVar1;
  short sVar2;
  cmpresult_t cVar3;
  bitcount_t bVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uECC_word_t uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  char num_words;
  uECC_word_t tmp [4];
  uECC_word_t *k2 [2];
  uECC_word_t s [4];
  uECC_word_t p [8];
  uECC_word_t local_d8 [4];
  uint8_t *local_b8;
  uint8_t *local_b0;
  uECC_word_t *local_a8 [2];
  uECC_word_t local_98 [4];
  uECC_word_t local_78 [9];
  
  local_a8[0] = local_d8;
  local_a8[1] = local_98;
  cVar1 = curve->num_words;
  lVar11 = (long)cVar1;
  sVar2 = curve->num_n_bits;
  iVar13 = sVar2 + 0x3f;
  iVar5 = sVar2 + 0x7e;
  if (-1 < iVar13) {
    iVar5 = iVar13;
  }
  if (lVar11 < 1) {
    iVar13 = 0;
  }
  else {
    lVar7 = 0;
    uVar9 = 0;
    do {
      uVar9 = uVar9 | k[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar11 != lVar7);
    iVar13 = 0;
    if (uVar9 != 0) {
      left = curve->n;
      num_words = (char)(iVar5 >> 6);
      local_b8 = private_key;
      local_b0 = message_hash;
      cVar3 = uECC_vli_cmp(left,k,num_words);
      iVar13 = 0;
      if (cVar3 == '\x01') {
        uVar8 = regularize_k(k,local_d8,local_98,curve);
        iVar13 = 0;
        EccPoint_mult(local_78,curve->G,local_a8[uVar8 ^ 1],(uECC_word_t *)0x0,sVar2 + 1,curve);
        if ('\0' < cVar1) {
          lVar7 = 0;
          uVar9 = 0;
          do {
            uVar9 = uVar9 | local_78[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar11 != lVar7);
          iVar13 = 0;
          if (uVar9 != 0) {
            if (g_rng_function == (uECC_RNG_Function)0x0) {
              if ('\0' < num_words) {
                memset(local_d8,0,(ulong)((iVar5 >> 6 & 0x7fU) << 3));
              }
              local_d8[0] = 1;
            }
            else {
              iVar5 = uECC_generate_random_int(local_d8,left,num_words);
              if (iVar5 == 0) {
                return 0;
              }
            }
            uECC_vli_modMult(k,k,local_d8,left,num_words);
            uECC_vli_modInv(k,k,left,num_words);
            uECC_vli_modMult(k,k,local_d8,left,num_words);
            uVar6 = (uint)curve->num_bytes;
            if ('\0' < curve->num_bytes) {
              lVar7 = (long)(int)uVar6;
              iVar5 = uVar6 * 8;
              lVar12 = 0;
              do {
                iVar5 = iVar5 + -8;
                uVar6 = uVar6 - 1;
                signature[lVar12] =
                     (uint8_t)(*(ulong *)((long)local_78 + (ulong)(uVar6 & 0xfffffff8)) >>
                              ((byte)iVar5 & 0x38));
                lVar12 = lVar12 + 1;
              } while (lVar7 != lVar12);
            }
            iVar5 = curve->num_n_bits + 7;
            iVar10 = curve->num_n_bits + 0xe;
            if (-1 < iVar5) {
              iVar10 = iVar5;
            }
            uECC_vli_bytesToNative(local_d8,local_b8,iVar10 >> 3);
            local_98[(long)num_words + -1] = 0;
            if ('\0' < cVar1) {
              memcpy(local_98,local_78,lVar11 << 3);
            }
            uECC_vli_modMult(local_98,local_d8,local_98,left,num_words);
            bits2int(local_d8,local_b0,hash_size,curve);
            uECC_vli_modAdd(local_98,local_d8,local_98,left,num_words);
            uECC_vli_modMult(local_98,local_98,k,left,num_words);
            bVar4 = uECC_vli_numBits(local_98,num_words);
            uVar6 = (uint)curve->num_bytes;
            iVar5 = uVar6 * 8;
            if (bVar4 <= iVar5) {
              lVar11 = (long)(int)uVar6;
              iVar13 = 1;
              if ('\0' < curve->num_bytes) {
                lVar7 = 0;
                do {
                  uVar6 = uVar6 - 1;
                  iVar5 = iVar5 + -8;
                  signature[lVar7 + lVar11] =
                       (uint8_t)(*(ulong *)((long)local_98 + (ulong)(uVar6 & 0xfffffff8)) >>
                                ((byte)iVar5 & 0x38));
                  lVar7 = lVar7 + 1;
                } while (lVar11 != lVar7);
              }
            }
          }
        }
      }
    }
  }
  return iVar13;
}

Assistant:

static int uECC_sign_with_k(const uint8_t *private_key,
                            const uint8_t *message_hash,
                            unsigned hash_size,
                            uECC_word_t *k,
                            uint8_t *signature,
                            uECC_Curve curve) {

    uECC_word_t tmp[uECC_MAX_WORDS];
    uECC_word_t s[uECC_MAX_WORDS];
    uECC_word_t *k2[2] = {tmp, s};
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    uECC_word_t *p = (uECC_word_t *)signature;
#else
    uECC_word_t p[uECC_MAX_WORDS * 2];
#endif
    uECC_word_t carry;
    wordcount_t num_words = curve->num_words;
    wordcount_t num_n_words = BITS_TO_WORDS(curve->num_n_bits);
    bitcount_t num_n_bits = curve->num_n_bits;

    /* Make sure 0 < k < curve_n */
    if (uECC_vli_isZero(k, num_words) || uECC_vli_cmp(curve->n, k, num_n_words) != 1) {
        return 0;
    }

    carry = regularize_k(k, tmp, s, curve);
    EccPoint_mult(p, curve->G, k2[!carry], 0, num_n_bits + 1, curve);
    if (uECC_vli_isZero(p, num_words)) {
        return 0;
    }

    /* If an RNG function was specified, get a random number
       to prevent side channel analysis of k. */
    if (!g_rng_function) {
        uECC_vli_clear(tmp, num_n_words);
        tmp[0] = 1;
    } else if (!uECC_generate_random_int(tmp, curve->n, num_n_words)) {
        return 0;
    }

    /* Prevent side channel analysis of uECC_vli_modInv() to determine
       bits of k / the private key by premultiplying by a random number */
    uECC_vli_modMult(k, k, tmp, curve->n, num_n_words); /* k' = rand * k */
    uECC_vli_modInv(k, k, curve->n, num_n_words);       /* k = 1 / k' */
    uECC_vli_modMult(k, k, tmp, curve->n, num_n_words); /* k = 1 / k */

#if uECC_VLI_NATIVE_LITTLE_ENDIAN == 0
    uECC_vli_nativeToBytes(signature, curve->num_bytes, p); /* store r */
#endif

#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    bcopy((uint8_t *) tmp, private_key, BITS_TO_BYTES(curve->num_n_bits));
#else
    uECC_vli_bytesToNative(tmp, private_key, BITS_TO_BYTES(curve->num_n_bits)); /* tmp = d */
#endif

    s[num_n_words - 1] = 0;
    uECC_vli_set(s, p, num_words);
    uECC_vli_modMult(s, tmp, s, curve->n, num_n_words); /* s = r*d */

    bits2int(tmp, message_hash, hash_size, curve);
    uECC_vli_modAdd(s, tmp, s, curve->n, num_n_words); /* s = e + r*d */
    uECC_vli_modMult(s, s, k, curve->n, num_n_words);  /* s = (e + r*d) / k */
    if (uECC_vli_numBits(s, num_n_words) > (bitcount_t)curve->num_bytes * 8) {
        return 0;
    }
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    bcopy((uint8_t *) signature + curve->num_bytes, (uint8_t *) s, curve->num_bytes);
#else
    uECC_vli_nativeToBytes(signature + curve->num_bytes, curve->num_bytes, s);
#endif    
    return 1;
}